

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool __thiscall storage::BTree::_insert_(BTree *this,int key,Record *record)

{
  char cVar1;
  int iVar2;
  BTInnerNode *this_00;
  BTLeafNode *pBVar3;
  BTLeafNode *this_01;
  BTNode *pBVar4;
  BTLeafNode *pBVar5;
  bool err;
  int newk;
  bool local_45;
  int local_44;
  BTree *local_40;
  BTLeafNode *local_38;
  
  pBVar5 = (BTLeafNode *)this->root_;
  if (pBVar5 == (BTLeafNode *)0x0) {
    pBVar4 = (BTNode *)operator_new(0x278);
    pBVar4->parent_ = (BTNode *)0x0;
    pBVar4->child_index_ = -1;
    pBVar4->_vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109d90;
    memset(&pBVar4[1].parent_,0,0x188);
    this->root_ = pBVar4;
    pBVar4->used_links_count_ = 2;
    pBVar4->keys_[0] = key;
    pBVar4[1]._vptr_BTNode = (_func_int **)record;
    pBVar4[2].keys_[0x27] = 0;
    pBVar4[2].keys_[0x28] = 0;
    cVar1 = '\x01';
  }
  else {
    local_40 = this;
    local_38 = pBVar5;
    iVar2 = (**(pBVar5->super_BTNode)._vptr_BTNode)(pBVar5);
    if ((char)iVar2 == '\0') {
      do {
        this_00 = (BTInnerNode *)__dynamic_cast(pBVar5,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        BTInnerNode::search_node(this_00,key,(BTNode **)&local_38);
        pBVar5 = local_38;
        iVar2 = (**(local_38->super_BTNode)._vptr_BTNode)(local_38);
      } while ((char)iVar2 == '\0');
    }
    local_45 = false;
    pBVar3 = (BTLeafNode *)__dynamic_cast(pBVar5,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    pBVar3 = BTLeafNode::insert_(pBVar3,key,record,&local_45);
    cVar1 = local_45;
    if (pBVar3 != (BTLeafNode *)0x0 && local_45 == true) {
      iVar2 = (pBVar3->super_BTNode).keys_[0];
      do {
        pBVar4 = (pBVar5->super_BTNode).parent_;
        if ((pBVar4 == (BTNode *)0x0) ||
           (this_01 = (BTLeafNode *)
                      __dynamic_cast(pBVar4,&BTNode::typeinfo,&BTInnerNode::typeinfo,0),
           this_01 == (BTLeafNode *)0x0)) {
          pBVar4 = (BTNode *)operator_new(0x278);
          pBVar4->parent_ = (BTNode *)0x0;
          pBVar4->child_index_ = -1;
          pBVar4->_vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109db0;
          memset(pBVar4 + 1,0,0x198);
          pBVar4->used_links_count_ = 2;
          pBVar4->keys_[0] = iVar2;
          if ((pBVar5->super_BTNode).keys_[0] < (pBVar3->super_BTNode).keys_[0]) {
            pBVar4[1]._vptr_BTNode = (_func_int **)pBVar5;
            (pBVar5->super_BTNode).parent_ = pBVar4;
            (pBVar5->super_BTNode).child_index_ = 0;
            pBVar4[1].parent_ = &pBVar3->super_BTNode;
            pBVar5 = pBVar3;
          }
          else {
            pBVar4[1]._vptr_BTNode = (_func_int **)pBVar3;
            (pBVar3->super_BTNode).parent_ = pBVar4;
            (pBVar3->super_BTNode).child_index_ = 0;
            pBVar4[1].parent_ = &pBVar5->super_BTNode;
          }
          (pBVar5->super_BTNode).parent_ = pBVar4;
          (pBVar5->super_BTNode).child_index_ = 1;
          local_40->root_ = pBVar4;
          return (bool)cVar1;
        }
        local_44 = 0;
        pBVar3 = (BTLeafNode *)
                 BTInnerNode::insert_((BTInnerNode *)this_01,iVar2,&pBVar3->super_BTNode,&local_44);
        pBVar5 = this_01;
        iVar2 = local_44;
      } while (pBVar3 != (BTLeafNode *)0x0);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool BTree::_insert_(int key, Record *record) {
        if (!root_) {
            auto t = new BTLeafNode;
            root_ = t;
            t->used_links_count_ = 2;
            t->keys_[0] = key;
            t->record_links_[0] = record;
            t->next_ = nullptr;
            return true;
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        bool err = false;
        BTNode *M = dynamic_cast<BTLeafNode *>(node)->insert_(key, record, err);
        if (!err) return false; // exists

        int kk = 0;
        if (M) kk = M->keys_[0];
        while (M) {
            BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
            if (!parent) {
                BTInnerNode *rt = new BTInnerNode;
                rt->used_links_count_ = 2;
                rt->keys_[0] = kk;
                if (node->keys_[0] < M->keys_[0]) {
                    rt->set_link(0, node);//rt->links_[0] = node;
                    rt->set_link(1, M);//rt->links_[1] = M;
                } else {
                    rt->set_link(0, M);//rt->links_[0] = M;
                    rt->set_link(1, node);//rt->links_[1] = node;
                }
                root_ = rt;
                rt->resolve_brother();
                break;
            } else {
                int newk = 0;
                M = parent->insert_(kk, M, newk);
                kk = newk;
                node = parent;
            }
        }
        return true;
    }